

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_regex_traits.hpp
# Opt level: O0

bool boost::xpressive::cpp_regex_traits<char>::
     compare_<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
               (char_type *name,
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     end)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  char *in_RDI;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffc8;
  uint7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  bool local_21;
  char *local_20;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10 [2];
  
  local_20 = in_RDI;
  while( true ) {
    local_21 = false;
    if (*local_20 != '\0') {
      local_21 = __gnu_cxx::operator!=
                           ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffc8);
    }
    if (local_21 == false) break;
    cVar1 = *local_20;
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(local_10);
    if (cVar1 != *pcVar3) {
      return false;
    }
    local_20 = local_20 + 1;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(local_10);
  }
  if (*local_20 != '\0') {
    return false;
  }
  bVar2 = __gnu_cxx::operator==
                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(ulong)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return bVar2;
}

Assistant:

static bool compare_(char_type const *name, FwdIter begin, FwdIter end)
    {
        for(; *name && begin != end; ++name, ++begin)
        {
            if(*name != *begin)
            {
                return false;
            }
        }
        return !*name && begin == end;
    }